

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O0

wchar_t doextlist(char **namelist,char **desclist,wchar_t listlen)

{
  nh_menuitem *pnVar1;
  nh_menuitem *_item_;
  nh_menuitem *items;
  wchar_t local_130;
  wchar_t size;
  wchar_t icount;
  wchar_t i;
  char buf [256];
  wchar_t listlen_local;
  char **desclist_local;
  char **namelist_local;
  
  local_130 = L'\0';
  _item_ = (nh_menuitem *)malloc((long)listlen * 0x10c);
  items._4_4_ = listlen;
  for (size = L'\0'; size < listlen; size = size + L'\x01') {
    sprintf((char *)&icount," %s\t- %s.",namelist[size],desclist[size]);
    if (items._4_4_ <= local_130) {
      items._4_4_ = items._4_4_ << 1;
      _item_ = (nh_menuitem *)realloc(_item_,(long)items._4_4_ * 0x10c);
    }
    pnVar1 = _item_ + local_130;
    pnVar1->id = 0;
    pnVar1->role = MI_TEXT;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,(char *)&icount);
    local_130 = local_130 + L'\x01';
  }
  curses_display_menu((nh_menuitem_conflict *)_item_,local_130,"Extended Commands List",L'\0',
                      (wchar_t *)0x0);
  return L'\0';
}

Assistant:

static int doextlist(const char **namelist, const char **desclist, int listlen)
{
    char buf[BUFSZ];
    int i, icount = 0, size = listlen;
    struct nh_menuitem *items = malloc(sizeof(struct nh_menuitem) * size);

    for (i = 0; i < listlen; i++) {
	    sprintf(buf, " %s\t- %s.", namelist[i], desclist[i]);
	    add_menu_txt(items, size, icount, buf, MI_TEXT);
    }
    curses_display_menu(items, icount, "Extended Commands List", PICK_NONE, NULL);

    return 0;
}